

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

void Bmcs_ManPrintFrame(Bmcs_Man_t *p,int f,int nClauses,int Solver,abctime clkStart)

{
  int iVar1;
  long lVar2;
  int iVar3;
  satoko_t *psVar4;
  Gia_Man_t *p_00;
  double dVar5;
  undefined1 auVar6 [16];
  timespec ts;
  timespec local_28;
  
  if (p->pPars->fVerbose != 0) {
    Abc_Print((int)p,"%4d %s : ",f,"+");
    psVar4 = p->pSats[0];
    iVar1 = satoko_varnum(psVar4);
    Abc_Print((int)psVar4,"Var =%8.0f.  ",(double)iVar1);
    psVar4 = p->pSats[0];
    iVar1 = satoko_clausenum(psVar4);
    Abc_Print((int)psVar4,"Cla =%9.0f.  ",(double)iVar1);
    psVar4 = p->pSats[0];
    iVar1 = satoko_learntnum(psVar4);
    Abc_Print((int)psVar4,"Learn =%9.0f.  ",(double)iVar1);
    psVar4 = p->pSats[0];
    iVar1 = satoko_conflictnum(psVar4);
    iVar3 = (int)psVar4;
    Abc_Print(iVar3,"Conf =%9.0f.  ",(double)iVar1);
    if (1 < p->pPars->nProcs) {
      Abc_Print(iVar3,"S = %3d. ",(ulong)(uint)Solver);
    }
    p_00 = p->pFrames;
    dVar5 = Gia_ManMemory(p_00);
    iVar1 = (p->vFr2Sat).nCap;
    auVar6._8_4_ = iVar1 >> 0x1f;
    auVar6._0_8_ = (long)iVar1;
    auVar6._12_4_ = 0x45300000;
    Abc_Print((int)p_00,"%4.0f MB",
              (((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0 +
              (double)(int)dVar5) * 9.5367431640625e-07);
    iVar3 = 3;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar2 = -1;
    }
    else {
      lVar2 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    Abc_Print(iVar3,"%9.2f sec  ",(double)((float)(lVar2 - clkStart) / 1e+06));
    putchar(10);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Bmcs_ManPrintFrame( Bmcs_Man_t * p, int f, int nClauses, int Solver, abctime clkStart )
{
    int fUnfinished = 0;
    if ( !p->pPars->fVerbose )
        return;
    Abc_Print( 1, "%4d %s : ", f,   fUnfinished ? "-" : "+" );
#ifndef ABC_USE_EXT_SOLVERS
    Abc_Print( 1, "Var =%8.0f.  ",  (double)satoko_varnum(p->pSats[0]) ); 
    Abc_Print( 1, "Cla =%9.0f.  ",  (double)satoko_clausenum(p->pSats[0]) );  
    Abc_Print( 1, "Learn =%9.0f.  ",(double)satoko_learntnum(p->pSats[0]) );  
    Abc_Print( 1, "Conf =%9.0f.  ", (double)satoko_conflictnum(p->pSats[0]) );  
#else
    Abc_Print( 1, "Var =%8.0f.  ",  (double)p->nSatVars ); 
    Abc_Print( 1, "Cla =%9.0f.  ",  (double)nClauses );  
#endif
    if ( p->pPars->nProcs > 1 )
        Abc_Print( 1, "S = %3d. ",  Solver );
    Abc_Print( 1, "%4.0f MB",       1.0*((int)Gia_ManMemory(p->pFrames) + Vec_IntMemory(&p->vFr2Sat))/(1<<20) );
    Abc_Print( 1, "%9.2f sec  ",    (float)(Abc_Clock() - clkStart)/(float)(CLOCKS_PER_SEC) );
    printf( "\n" );
    fflush( stdout );
}